

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# deserializer.hpp
# Opt level: O2

type * __thiscall
duckdb::Deserializer::
Read<std::map<unsigned_long,duckdb::unique_ptr<duckdb::TableFilter,std::default_delete<duckdb::TableFilter>,true>,std::less<unsigned_long>,std::allocator<std::pair<unsigned_long_const,duckdb::unique_ptr<duckdb::TableFilter,std::default_delete<duckdb::TableFilter>,true>>>>>
          (type *__return_storage_ptr__,Deserializer *this)

{
  _Rb_tree_header *p_Var1;
  _Head_base<0UL,_duckdb::TableFilter_*,_false> _Var2;
  undefined1 auVar3 [8];
  int iVar4;
  undefined4 extraout_var;
  mapped_type *pmVar5;
  long lVar6;
  bool bVar7;
  undefined1 local_40 [8];
  unsigned_long key;
  
  (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  p_Var1 = &(__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header;
  (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left =
       &p_Var1->_M_header;
  (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_header._M_right =
       &p_Var1->_M_header;
  (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_node_count = 0;
  iVar4 = (*this->_vptr_Deserializer[8])(this);
  lVar6 = CONCAT44(extraout_var,iVar4);
  while( true ) {
    bVar7 = lVar6 == 0;
    lVar6 = lVar6 + -1;
    if (bVar7) break;
    (*this->_vptr_Deserializer[6])(this);
    key = ReadProperty<unsigned_long>(this,0,"key");
    ReadProperty<duckdb::unique_ptr<duckdb::TableFilter,std::default_delete<duckdb::TableFilter>,true>>
              ((Deserializer *)local_40,(field_id_t)this,(char *)0x1);
    (*this->_vptr_Deserializer[7])(this);
    pmVar5 = ::std::
             map<unsigned_long,_duckdb::unique_ptr<duckdb::TableFilter,_std::default_delete<duckdb::TableFilter>,_true>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_duckdb::unique_ptr<duckdb::TableFilter,_std::default_delete<duckdb::TableFilter>,_true>_>_>_>
             ::operator[](__return_storage_ptr__,&key);
    auVar3 = local_40;
    local_40 = (undefined1  [8])0x0;
    _Var2._M_head_impl =
         (pmVar5->super_unique_ptr<duckdb::TableFilter,_std::default_delete<duckdb::TableFilter>_>).
         _M_t.super___uniq_ptr_impl<duckdb::TableFilter,_std::default_delete<duckdb::TableFilter>_>.
         _M_t.
         super__Tuple_impl<0UL,_duckdb::TableFilter_*,_std::default_delete<duckdb::TableFilter>_>.
         super__Head_base<0UL,_duckdb::TableFilter_*,_false>._M_head_impl;
    (pmVar5->super_unique_ptr<duckdb::TableFilter,_std::default_delete<duckdb::TableFilter>_>)._M_t.
    super___uniq_ptr_impl<duckdb::TableFilter,_std::default_delete<duckdb::TableFilter>_>._M_t.
    super__Tuple_impl<0UL,_duckdb::TableFilter_*,_std::default_delete<duckdb::TableFilter>_>.
    super__Head_base<0UL,_duckdb::TableFilter_*,_false>._M_head_impl = (TableFilter *)auVar3;
    if (_Var2._M_head_impl != (TableFilter *)0x0) {
      (**(code **)((long)(_Var2._M_head_impl)->_vptr_TableFilter + 8))();
    }
    if (local_40 != (undefined1  [8])0x0) {
      (*(*(_func_int ***)local_40)[1])();
    }
  }
  (*this->_vptr_Deserializer[9])(this);
  return __return_storage_ptr__;
}

Assistant:

inline typename std::enable_if<is_map<T>::value, T>::type Read() {
		using KEY_TYPE = typename is_map<T>::KEY_TYPE;
		using VALUE_TYPE = typename is_map<T>::VALUE_TYPE;

		T map;
		auto size = OnListBegin();
		for (idx_t i = 0; i < size; i++) {
			OnObjectBegin();
			auto key = ReadProperty<KEY_TYPE>(0, "key");
			auto value = ReadProperty<VALUE_TYPE>(1, "value");
			OnObjectEnd();
			map[std::move(key)] = std::move(value);
		}
		OnListEnd();
		return map;
	}